

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

double ClipperLib::Area(OutPt *op)

{
  OutPt **ppOVar1;
  OutPt *pOVar2;
  double dVar3;
  
  dVar3 = 0.0;
  pOVar2 = op;
  if (op != (OutPt *)0x0) {
    do {
      ppOVar1 = &pOVar2->Next;
      dVar3 = dVar3 + (double)((pOVar2->Prev->Pt).Y - (pOVar2->Pt).Y) *
                      (double)((pOVar2->Pt).X + (pOVar2->Prev->Pt).X);
      pOVar2 = *ppOVar1;
    } while (*ppOVar1 != op);
    dVar3 = dVar3 * 0.5;
  }
  return dVar3;
}

Assistant:

double Area(const OutPt *op)
{
  const OutPt *startOp = op;
  if (!op) return 0;
  double a = 0;
  do {
    a +=  (double)(op->Prev->Pt.X + op->Pt.X) * (double)(op->Prev->Pt.Y - op->Pt.Y);
    op = op->Next;
  } while (op != startOp);
  return a * 0.5;
}